

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::ConvertToSampledImagePass::UpdateSampledImageUses
          (ConvertToSampledImagePass *this,Instruction *image_load,Instruction *image_extraction,
          DescriptorSetAndBinding *image_descriptor_set_binding)

{
  initializer_list<unsigned_int> init_list;
  Instruction *this_00;
  bool bVar1;
  uint32_t before;
  uint32_t after;
  IRContext *pIVar2;
  DefUseManager *this_01;
  reference ppIVar3;
  uint32_t local_a4;
  iterator local_a0;
  undefined8 local_98;
  SmallVector<unsigned_int,_2UL> local_90;
  Instruction *local_68;
  Instruction *sampled_image_inst;
  iterator __end2;
  iterator __begin2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  DefUseManager *def_use_mgr;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  sampled_image_users;
  DescriptorSetAndBinding *image_descriptor_set_binding_local;
  Instruction *image_extraction_local;
  Instruction *image_load_local;
  ConvertToSampledImagePass *this_local;
  
  sampled_image_users.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)image_descriptor_set_binding;
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &def_use_mgr);
  FindUses(this,image_load,
           (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
           &def_use_mgr,OpSampledImage);
  pIVar2 = Pass::context(&this->super_Pass);
  this_01 = IRContext::get_def_use_mgr(pIVar2);
  __end2 = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ::begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    *)&def_use_mgr);
  sampled_image_inst =
       (Instruction *)
       std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::end
                 ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   *)&def_use_mgr);
  image_descriptor_set_binding_local = (DescriptorSetAndBinding *)image_extraction;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                *)&sampled_image_inst);
    if (!bVar1) break;
    ppIVar3 = __gnu_cxx::
              __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
              ::operator*(&__end2);
    local_68 = *ppIVar3;
    bVar1 = IsSamplerOfSampledImageDecoratedByDescriptorSetBinding
                      (this,local_68,
                       (DescriptorSetAndBinding *)
                       sampled_image_users.
                       super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar1) {
      pIVar2 = Pass::context(&this->super_Pass);
      before = opt::Instruction::result_id(local_68);
      after = opt::Instruction::result_id(image_load);
      IRContext::ReplaceAllUsesWith(pIVar2,before,after);
      analysis::DefUseManager::AnalyzeInstUse(this_01,image_load);
      pIVar2 = Pass::context(&this->super_Pass);
      IRContext::KillInst(pIVar2,local_68);
    }
    else {
      if (image_descriptor_set_binding_local == (DescriptorSetAndBinding *)0x0) {
        image_descriptor_set_binding_local =
             (DescriptorSetAndBinding *)CreateImageExtraction(this,image_load);
      }
      this_00 = local_68;
      local_a4 = opt::Instruction::result_id((Instruction *)image_descriptor_set_binding_local);
      local_a0 = &local_a4;
      local_98 = 1;
      init_list._M_len = 1;
      init_list._M_array = local_a0;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_90,init_list);
      opt::Instruction::SetInOperand(this_00,0,&local_90);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_90);
      analysis::DefUseManager::AnalyzeInstUse(this_01,local_68);
    }
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
    ::operator++(&__end2);
  }
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::~vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &def_use_mgr);
  return;
}

Assistant:

void ConvertToSampledImagePass::UpdateSampledImageUses(
    Instruction* image_load, Instruction* image_extraction,
    const DescriptorSetAndBinding& image_descriptor_set_binding) {
  std::vector<Instruction*> sampled_image_users;
  FindUses(image_load, &sampled_image_users, spv::Op::OpSampledImage);

  auto* def_use_mgr = context()->get_def_use_mgr();
  for (auto* sampled_image_inst : sampled_image_users) {
    if (IsSamplerOfSampledImageDecoratedByDescriptorSetBinding(
            sampled_image_inst, image_descriptor_set_binding)) {
      context()->ReplaceAllUsesWith(sampled_image_inst->result_id(),
                                    image_load->result_id());
      def_use_mgr->AnalyzeInstUse(image_load);
      context()->KillInst(sampled_image_inst);
    } else {
      if (!image_extraction)
        image_extraction = CreateImageExtraction(image_load);
      sampled_image_inst->SetInOperand(0, {image_extraction->result_id()});
      def_use_mgr->AnalyzeInstUse(sampled_image_inst);
    }
  }
}